

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fisheye.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char **ppcVar1;
  char *__s2;
  int iVar2;
  int iVar3;
  GLFWwindow *handle;
  long lVar4;
  EVP_PKEY_CTX *ctx;
  char **__args;
  int iVar5;
  
  if (1 < argc) {
    iVar5 = 1;
    do {
      lVar4 = (long)iVar5;
      __s2 = argv[lVar4];
      iVar3 = strcmp("--envmap",__s2);
      if (iVar3 == 0) {
        std::vector<const_char_*,_std::allocator<const_char_*>_>::resize(&g_ibl.files,0);
        iVar3 = iVar5 + 2;
        if (iVar5 + 2 < argc) {
          iVar3 = argc;
        }
        __args = argv + lVar4 + 1;
        lVar4 = lVar4 + 2;
        do {
          if (g_ibl.files.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              g_ibl.files.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<char_const*,std::allocator<char_const*>>::
            _M_realloc_insert<char_const*const&>
                      ((vector<char_const*,std::allocator<char_const*>> *)&g_ibl,
                       (iterator)
                       g_ibl.files.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish,__args);
          }
          else {
            *g_ibl.files.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_finish = *__args;
            g_ibl.files.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 g_ibl.files.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                 .super__Vector_impl_data._M_finish + 1;
          }
          iVar2 = iVar3 + -1;
          if ((long)(ulong)(uint)argc <= lVar4) break;
          ppcVar1 = __args + 1;
          __args = __args + 1;
          lVar4 = lVar4 + 1;
          iVar5 = iVar5 + 1;
          iVar2 = iVar5;
        } while (**ppcVar1 != '-');
        iVar5 = iVar2;
        fprintf(_stdout,"Note: number of Envmaps set to %i\n",
                (ulong)((long)g_ibl.files.
                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)g_ibl.files.
                             super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                             .super__Vector_impl_data._M_start) >> 3);
LAB_001361af:
        fflush(_stdout);
      }
      else {
        iVar3 = strcmp("--shader-dir",__s2);
        if (iVar3 == 0) {
          iVar5 = iVar5 + 1;
          g_app.dir.shader = argv[lVar4 + 1];
          fprintf(_stdout,"Note: shader dir set to %s\n");
          goto LAB_001361af;
        }
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 < argc);
  }
  glfwInit();
  glfwWindowHint(0x22002,4);
  glfwWindowHint(0x22003,5);
  glfwWindowHint(0x22008,0x32001);
  glfwWindowHint(0x22007,1);
  fwrite("Loading {Window-Main}\n",0x16,1,_stdout);
  fflush(_stdout);
  handle = glfwCreateWindow(0x690,0x41a,"Hello MERL",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
  if (handle == (GLFWwindow *)0x0) {
    fwrite("=> Failure <=\n",0xe,1,_stdout);
    fflush(_stdout);
    glfwTerminate();
  }
  else {
    glfwMakeContextCurrent(handle);
    glfwSetKeyCallback(handle,keyboardCallback);
    glfwSetCursorPosCallback(handle,mouseMotionCallback);
    glfwSetMouseButtonCallback(handle,mouseButtonCallback);
    glfwSetScrollCallback(handle,mouseScrollCallback);
    fwrite("Loading {OpenGL}\n",0x11,1,_stdout);
    fflush(_stdout);
    iVar5 = gladLoadGLLoader(glfwGetProcAddress);
    if (iVar5 != 0) {
      fwrite("-- Begin -- Demo\n",0x11,1,_stdout);
      fflush(_stdout);
      ImGui::CreateContext((ImFontAtlas *)0x0);
      ImGui_ImplGlfwGL3_Init(handle,false,(char *)0x0);
      ctx = (EVP_PKEY_CTX *)0x0;
      ImGui::StyleColorsDark((ImGuiStyle *)0x0);
      init(ctx);
      while (iVar5 = glfwWindowShouldClose(handle), iVar5 == 0) {
        glfwPollEvents();
        (*glad_glClearColor)(0.8,0.8,0.8,1.0);
        (*glad_glClear)(0x4000);
        render();
        glfwSwapBuffers(handle);
      }
      release();
      ImGui_ImplGlfwGL3_Shutdown();
      ImGui::DestroyContext((ImGuiContext *)0x0);
      glfwTerminate();
      fwrite("-- End -- Demo\n",0xf,1,_stdout);
      fflush(_stdout);
      return 0;
    }
    fwrite("gladLoadGLLoader failed\n",0x18,1,_stdout);
    fflush(_stdout);
  }
  return -1;
}

Assistant:

int main(int argc, const char **argv)
{
    for (int i = 1; i < argc; ++i) {
        if (!strcmp("--envmap", argv[i])) {
            g_ibl.files.resize(0);
            do {
                g_ibl.files.push_back(argv[++i]);
            } while ((i+1 < argc) && strncmp("-", argv[i+1], 1));
            LOG("Note: number of Envmaps set to %i\n", (int)g_ibl.files.size());
        } else if (!strcmp("--shader-dir", argv[i])) {
            g_app.dir.shader = argv[++i];
            LOG("Note: shader dir set to %s\n", g_app.dir.shader);
        }
    }

    glfwInit();
    glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 4);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 5);
    glfwWindowHint(GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE);
    glfwWindowHint(GLFW_OPENGL_DEBUG_CONTEXT, GL_TRUE);

    // Create the Window
    LOG("Loading {Window-Main}\n");
    GLFWwindow* window = glfwCreateWindow(
                             VIEWER_DEFAULT_WIDTH,
                             VIEWER_DEFAULT_HEIGHT,
                             "Hello MERL", NULL, NULL
                             );
    if (window == NULL) {
        LOG("=> Failure <=\n");
        glfwTerminate();
        return -1;
    }
    glfwMakeContextCurrent(window);
    glfwSetKeyCallback(window, &keyboardCallback);
    glfwSetCursorPosCallback(window, &mouseMotionCallback);
    glfwSetMouseButtonCallback(window, &mouseButtonCallback);
    glfwSetScrollCallback(window, &mouseScrollCallback);

    // Load OpenGL functions
    LOG("Loading {OpenGL}\n");
    if (!gladLoadGLLoader((GLADloadproc)glfwGetProcAddress)) {
        LOG("gladLoadGLLoader failed\n");
        return -1;
    }

    LOG("-- Begin -- Demo\n");
    try {
        //log_debug_output();
        ImGui::CreateContext();
        ImGui_ImplGlfwGL3_Init(window, false);
        ImGui::StyleColorsDark();
        init();

        while (!glfwWindowShouldClose(window)) {
            glfwPollEvents();

            glClearColor(0.8, 0.8, 0.8, 1.0);
            glClear(GL_COLOR_BUFFER_BIT);

            render();

            glfwSwapBuffers(window);
        }

        release();
        ImGui_ImplGlfwGL3_Shutdown();
        ImGui::DestroyContext();
        glfwTerminate();
    } catch (std::exception& e) {
        LOG("%s", e.what());
        ImGui_ImplGlfwGL3_Shutdown();
        ImGui::DestroyContext();
        glfwTerminate();
        LOG("(!) Demo Killed (!)\n");

        return EXIT_FAILURE;
    } catch (...) {
        ImGui_ImplGlfwGL3_Shutdown();
        ImGui::DestroyContext();
        glfwTerminate();
        LOG("(!) Demo Killed (!)\n");

        return EXIT_FAILURE;
    }
    LOG("-- End -- Demo\n");


    return 0;
}